

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_rar.c
# Opt level: O0

void test_read_format_rar_multivolume_w(void)

{
  skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                 ,L'Ы');
  test_skipping("archive_read_open_filenames_w is not available on this platform");
  return;
}

Assistant:

DEFINE_TEST(test_read_format_rar_multivolume_w)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
  const char *reffiles[] =
  {
    "test_read_format_rar_multivolume.part0001.rar",
    "test_read_format_rar_multivolume.part0002.rar",
    "test_read_format_rar_multivolume.part0003.rar",
    "test_read_format_rar_multivolume.part0004.rar",
    NULL
  };

  const wchar_t *wreffiles[] =
  {
    L"test_read_format_rar_multivolume.part0001.rar",
    L"test_read_format_rar_multivolume.part0002.rar",
    L"test_read_format_rar_multivolume.part0003.rar",
    L"test_read_format_rar_multivolume.part0004.rar",
    NULL
  };

  struct archive *a;

  extract_reference_files(reffiles);
  assert((a = archive_read_new()) != NULL);
  assertA(0 == archive_read_support_filter_all(a));
  assertA(0 == archive_read_support_format_all(a));
  assertA(0 == archive_read_open_filenames_w(a, wreffiles, 10240));

  test_read_format_rar_multivolume_test_body_helper(a);
#else
  skipping("archive_read_open_filenames_w is not available on this platform");
  return;
#endif
}